

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Log(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  FString *other;
  char *pcVar1;
  bool bVar2;
  bool local_5b;
  FString local_58;
  FString formatted;
  FString local_40;
  FString text;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc83,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc83,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  text.Chars = *(char **)&param->field_0;
  local_5b = true;
  if ((DObject *)text.Chars != (DObject *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)text.Chars,AActor::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc83,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc84,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x02') {
    __assert_fail("param[paramnum].Type == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc84,"int AF_AActor_A_Log(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  other = VMValue::s(param + 1);
  FString::FString(&local_40,other);
  pcVar1 = FString::operator[](&local_40,0);
  if (*pcVar1 == '$') {
    pcVar1 = FString::operator[](&local_40,1);
    pcVar1 = FStringTable::operator()(&GStrings,pcVar1);
    FString::operator=(&local_40,pcVar1);
  }
  FString::operator_cast_to_char_(&local_40);
  strbin1((char *)&local_58);
  pcVar1 = FString::GetChars(&local_58);
  Printf("%s\n",pcVar1);
  FString::~FString(&local_58);
  FString::~FString(&local_40);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Log)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_STRING(text);

	if (text[0] == '$') text = GStrings(&text[1]);
	FString formatted = strbin1(text);
	Printf("%s\n", formatted.GetChars());
	return 0;
}